

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalPiecewiseMergeJoin::ResolveSimpleJoin
          (PhysicalPiecewiseMergeJoin *this,ExecutionContext *context,DataChunk *input,
          DataChunk *chunk,OperatorState *state_p)

{
  OperatorState *this_00;
  char cVar1;
  __int_type _Var2;
  pointer pVVar3;
  int iVar4;
  int iVar5;
  pointer pGVar6;
  type pLVar7;
  const_reference pvVar8;
  type state;
  pointer pGVar9;
  reference pvVar10;
  pointer pLVar11;
  reference this_01;
  NotImplementedException *this_02;
  ulong uVar12;
  idx_t i;
  ulong uVar13;
  idx_t iVar14;
  DataChunk *left;
  ulong uVar15;
  idx_t iVar16;
  Vector *key;
  pointer this_03;
  bool external;
  DataChunk *local_9f0;
  DataChunk *local_9e8;
  ulong local_9e0;
  type local_9d8;
  DataChunk *local_9d0;
  pointer local_9c8;
  data_ptr_t l_ptr;
  int local_9b4;
  ulong local_9b0;
  data_ptr_t local_9a8;
  PhysicalPiecewiseMergeJoin *local_9a0;
  type local_998;
  idx_t local_990;
  SBScanState rread;
  SBScanState lread;
  bool found_match [2048];
  
  local_9f0 = chunk;
  pGVar6 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                       super_PhysicalJoin.super_CachingPhysicalOperator.super_PhysicalOperator.
                       sink_state);
  PiecewiseMergeJoinState::ResolveJoinKeys((PiecewiseMergeJoinState *)state_p,input);
  this_00 = state_p + 0x21;
  pLVar7 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator*((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                        *)this_00);
  switchD_016d4fed::default(found_match,0,0x800);
  pvVar8 = vector<duckdb::JoinCondition,_true>::get<true>
                     (&(this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.conditions,0);
  local_9b4 = MergeJoinComparisonValue(pvVar8->comparison);
  local_9e8 = (DataChunk *)state_p;
  state = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
          operator*((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                     *)(state_p + 0x22));
  pGVar6 = pGVar6 + 1;
  pGVar9 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                         *)pGVar6);
  local_9c8 = (pointer)CONCAT71(local_9c8._1_7_,(state->sort_layout).all_constant);
  external = state->external;
  SBScanState::SBScanState(&lread,state->buffer_manager,state);
  local_9d8 = state;
  pvVar10 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::get<true>(&state->sorted_blocks,0);
  lread.sb = (pvVar10->
             super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>)._M_t.
             super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
             .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
  pLVar11 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
            ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                          *)this_00);
  iVar16 = pLVar11->count;
  pLVar11 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
            ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
                          *)this_00);
  iVar14 = pLVar11->has_null;
  MergeJoinPinSortingBlock(&lread,0);
  lread.entry_idx = 0;
  l_ptr = SBScanState::RadixPtr(&lread);
  SBScanState::SBScanState
            (&rread,(pGVar9->global_sort_state).buffer_manager,&pGVar9->global_sort_state);
  local_9d0 = (DataChunk *)(iVar16 - iVar14);
  local_9a0 = this;
  pvVar10 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::get<true>(&(pGVar9->global_sort_state).sorted_blocks,0);
  rread.sb = (pvVar10->
             super_unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>)._M_t.
             super___uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
             .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl;
  local_990 = (local_9d8->sort_layout).comparison_size;
  iVar16 = (local_9d8->sort_layout).entry_size;
  uVar13 = 0;
  local_9e0 = 0;
  uVar15 = 0;
  local_9d8 = (type)&local_9d8->sort_layout;
  while (local_9b0 = uVar15,
        uVar15 < (ulong)((long)((rread.sb)->radix_sorting_data).
                               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)((rread.sb)->radix_sorting_data).
                               super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    MergeJoinPinSortingBlock(&rread,uVar15);
    this_01 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
              ::get<true>(&(rread.sb)->radix_sorting_data,uVar15);
    local_998 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
                operator*(this_01);
    iVar14 = local_998->count;
    pGVar9 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
             ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                           *)pGVar6);
    _Var2 = (pGVar9->count).super___atomic_base<unsigned_long>._M_i;
    pGVar9 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
             ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                           *)pGVar6);
    iVar4 = local_9b4;
    uVar15 = _Var2 - (pGVar9->has_null).super___atomic_base<unsigned_long>._M_i;
    uVar12 = iVar14 + local_9e0;
    if (uVar15 < local_9e0) {
      uVar15 = local_9e0;
    }
    if (uVar12 < uVar15) {
      uVar15 = uVar12;
    }
    if (uVar15 == local_9e0) break;
    uVar12 = ~local_9e0;
    local_9e0 = local_9e0 + local_998->count;
    rread.entry_idx = uVar15 + uVar12;
    local_9a8 = SBScanState::RadixPtr(&rread);
    while( true ) {
      if ((char)local_9c8 == '\0') {
        rread.entry_idx = uVar15 + uVar12;
        lread.entry_idx = uVar13;
        iVar5 = Comparators::CompareTuple
                          (&lread,&rread,&l_ptr,&local_9a8,(SortLayout *)local_9d8,&external);
      }
      else {
        iVar5 = FastMemcmp(l_ptr,local_9a8,local_990);
      }
      if (iVar4 < iVar5) break;
      found_match[uVar13] = true;
      uVar13 = uVar13 + 1;
      l_ptr = l_ptr + iVar16;
      if (local_9d0 <= uVar13) goto LAB_018e783a;
    }
    uVar15 = local_9b0 + 1;
  }
LAB_018e783a:
  SBScanState::~SBScanState(&rread);
  SBScanState::~SBScanState(&lread);
  left = (DataChunk *)((long)local_9e8 + 0x40);
  cVar1 = (local_9a0->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
          super_CachingPhysicalOperator.field_0x81;
  if (cVar1 == '\x05') {
    PhysicalJoin::ConstructSemiJoinResult(left,local_9f0,found_match);
  }
  else if (cVar1 == '\x06') {
    PhysicalJoin::ConstructAntiJoinResult(left,local_9f0,found_match);
  }
  else {
    local_9e8 = left;
    local_9c8 = pGVar6;
    if (cVar1 != '\a') {
      this_02 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&lread,"Unimplemented join type for merge join",(allocator *)&rread);
      NotImplementedException::NotImplementedException(this_02,(string *)&lread);
      __cxa_throw(this_02,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar16 = pLVar7->count - pLVar7->has_null;
    local_9d0 = &pLVar7->keys;
    pVVar3 = (pLVar7->keys).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (this_03 = (pLVar7->keys).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                   .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                   super__Vector_impl_data._M_start; this_03 != pVVar3; this_03 = this_03 + 1) {
      Vector::Flatten(this_03,(pLVar7->keys).count);
      FlatVector::VerifyFlatVector(this_03);
      if ((this_03->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
          (unsigned_long *)0x0) {
        TemplatedValidityMask<unsigned_long>::SetAllValid
                  (&(this_03->validity).super_TemplatedValidityMask<unsigned_long>,iVar16);
        for (iVar14 = iVar16; iVar14 < pLVar7->count; iVar14 = iVar14 + 1) {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&(this_03->validity).super_TemplatedValidityMask<unsigned_long>,iVar14);
        }
      }
    }
    pGVar9 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
             ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                           *)local_9c8);
    PhysicalJoin::ConstructMarkJoinResult
              (local_9d0,local_9e8,local_9f0,found_match,
               (pGVar9->has_null).super___atomic_base<unsigned_long>._M_i != 0);
  }
  return;
}

Assistant:

void PhysicalPiecewiseMergeJoin::ResolveSimpleJoin(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                   OperatorState &state_p) const {
	auto &state = state_p.Cast<PiecewiseMergeJoinState>();
	auto &gstate = sink_state->Cast<MergeJoinGlobalState>();

	state.ResolveJoinKeys(input);
	auto &lhs_table = *state.lhs_local_table;

	// perform the actual join
	bool found_match[STANDARD_VECTOR_SIZE];
	memset(found_match, 0, sizeof(found_match));
	MergeJoinSimpleBlocks(state, gstate, found_match, conditions[0].comparison);

	// use the sorted payload
	const auto lhs_not_null = lhs_table.count - lhs_table.has_null;
	auto &payload = state.lhs_payload;

	// now construct the result based on the join result
	switch (join_type) {
	case JoinType::MARK: {
		// The only part of the join keys that is actually used is the validity mask.
		// Since the payload is sorted, we can just set the tail end of the validity masks to invalid.
		for (auto &key : lhs_table.keys.data) {
			key.Flatten(lhs_table.keys.size());
			auto &mask = FlatVector::Validity(key);
			if (mask.AllValid()) {
				continue;
			}
			mask.SetAllValid(lhs_not_null);
			for (idx_t i = lhs_not_null; i < lhs_table.count; ++i) {
				mask.SetInvalid(i);
			}
		}
		// So we make a set of keys that have the validity mask set for the
		PhysicalJoin::ConstructMarkJoinResult(lhs_table.keys, payload, chunk, found_match, gstate.table->has_null);
		break;
	}
	case JoinType::SEMI:
		PhysicalJoin::ConstructSemiJoinResult(payload, chunk, found_match);
		break;
	case JoinType::ANTI:
		PhysicalJoin::ConstructAntiJoinResult(payload, chunk, found_match);
		break;
	default:
		throw NotImplementedException("Unimplemented join type for merge join");
	}
}